

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_graph_demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  SimpleState *this;
  reference ppSVar2;
  ostream *poVar3;
  int64_t iVar4;
  reference ppSVar5;
  SimpleState **e_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<SimpleState_*,_std::allocator<SimpleState_*>_> *__range1_3;
  SimpleState **e_2;
  iterator __end1_2;
  iterator __begin1_2;
  Path<SimpleState_*> *__range1_2;
  Path<SimpleState_*> path_d;
  SimpleState **e_1;
  iterator __end1_1;
  iterator __begin1_1;
  Path<SimpleState_*> *__range1_1;
  Path<SimpleState_*> path_a;
  _List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> *e;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  *__range1;
  vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  all_edges;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> graph;
  int j;
  int i;
  vector<SimpleState_*,_std::allocator<SimpleState_*>_> nodes;
  SimpleStateIndexer indexer;
  SimpleState *in_stack_fffffffffffffcc8;
  ostream *in_stack_fffffffffffffcd0;
  _func_double_SimpleState_ptr_SimpleState_ptr *in_stack_fffffffffffffcd8;
  function<double_(SimpleState_*,_SimpleState_*)> *in_stack_fffffffffffffce0;
  ostream *in_stack_fffffffffffffcf0;
  double in_stack_fffffffffffffcf8;
  SimpleState *in_stack_fffffffffffffd00;
  SimpleState *in_stack_fffffffffffffd08;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *in_stack_fffffffffffffd10;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *this_00;
  value_type pSVar6;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph_00;
  CalcHeuristicFunc_t<SimpleState_*,_double> *calc_heuristic;
  value_type pSVar7;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph_01;
  __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
  local_168;
  undefined1 *local_160;
  reference local_158;
  SimpleState **local_150;
  __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
  local_148;
  undefined1 *local_140;
  undefined1 local_138 [24];
  reference local_120;
  SimpleState **local_118;
  __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
  local_110;
  undefined1 *local_108;
  undefined1 local_e0 [24];
  reference local_c8;
  _List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> *local_c0;
  __normal_iterator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>_>
  local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [104];
  SimpleState *local_40;
  int local_38;
  int local_34;
  undefined1 local_30 [44];
  int local_4;
  
  local_4 = 0;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::vector
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)0x10134e);
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      this = (SimpleState *)operator_new(8);
      SimpleState::SimpleState(this,local_34,local_38);
      local_40 = this;
      std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::push_back
                ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffcd0,
                 (value_type *)in_stack_fffffffffffffcc8);
    }
  }
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Graph
            ((Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x101459);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,0);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,1);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,1);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,1);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,2);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,1);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,6);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,2);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,1);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,2);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,3);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,2);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,6);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,3);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,2);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,3);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,6);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  graph_01 = (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)local_30;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)graph_01,6);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)graph_01,1);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  calc_heuristic = (CalcHeuristicFunc_t<SimpleState_*,_double> *)local_30;
  ppSVar2 = std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
                      ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)calc_heuristic,6);
  pSVar7 = *ppSVar2;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)calc_heuristic,2);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,6);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,3);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  graph_00 = (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)local_30;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)graph_00,6);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)graph_00,9);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  ppSVar2 = std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
                      ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,6);
  pSVar6 = *ppSVar2;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,10);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,9);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,6);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,9);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,10);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,9);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,0xd);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,10);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,6);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,10);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,9);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,10);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,0xd);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  this_00 = (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)local_30;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)this_00,0xd);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)this_00,9);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,0xd);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::operator[]
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)local_30,10);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::GetAllEdges(this_00);
  local_b0 = local_a8;
  local_b8._M_current =
       (_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> *)
       std::
       vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
       ::begin((vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                *)in_stack_fffffffffffffcc8);
  local_c0 = (_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> *)
             std::
             vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
             ::end((vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                    *)in_stack_fffffffffffffcc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (!bVar1) break;
    local_c8 = __gnu_cxx::
               __normal_iterator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>_>
               ::operator*(&local_b8);
    std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>::operator->
              ((_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> *)
               0x101c67);
    xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge::PrintEdge
              ((Edge *)in_stack_fffffffffffffce0);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_*,_std::vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>_>
    ::operator++(&local_b8);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\nA* search: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::function<double(SimpleState*,SimpleState*)>::
  function<double(&)(SimpleState*,SimpleState*),void>
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  xmotion::AStar::Search<SimpleState*,double,SimpleStateIndexer,int>
            (graph_01,(int)((ulong)pSVar7 >> 0x20),(int)pSVar7,calc_heuristic);
  std::function<double_(SimpleState_*,_SimpleState_*)>::~function
            ((function<double_(SimpleState_*,_SimpleState_*)> *)0x101d2a);
  local_108 = local_e0;
  local_110._M_current =
       (SimpleState **)
       std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::begin
                 ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffcc8
                 );
  local_118 = (SimpleState **)
              std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::end
                        ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)
                         in_stack_fffffffffffffcc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (!bVar1) break;
    local_120 = __gnu_cxx::
                __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                ::operator*(&local_110);
    poVar3 = std::operator<<((ostream *)&std::cout,"id: ");
    iVar4 = SimpleStateIndexer::operator()((SimpleStateIndexer *)(local_30 + 0x1f),*local_120);
    in_stack_fffffffffffffcf0 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    std::ostream::operator<<(in_stack_fffffffffffffcf0,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>::
    operator++(&local_110);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\nDijkstra search: ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  xmotion::Dijkstra::Search<SimpleState*,double,SimpleStateIndexer,int>
            (graph_00,(int)((ulong)pSVar6 >> 0x20),(int)pSVar6);
  local_140 = local_138;
  local_148._M_current =
       (SimpleState **)
       std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::begin
                 ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffcc8
                 );
  local_150 = (SimpleState **)
              std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::end
                        ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)
                         in_stack_fffffffffffffcc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (!bVar1) break;
    local_158 = __gnu_cxx::
                __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                ::operator*(&local_148);
    in_stack_fffffffffffffce0 =
         (function<double_(SimpleState_*,_SimpleState_*)> *)
         std::operator<<((ostream *)&std::cout,"id: ");
    iVar4 = SimpleStateIndexer::operator()((SimpleStateIndexer *)(local_30 + 0x1f),*local_158);
    in_stack_fffffffffffffcd0 =
         (ostream *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffce0,iVar4);
    std::ostream::operator<<(in_stack_fffffffffffffcd0,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>::
    operator++(&local_148);
  }
  local_160 = local_30;
  local_168._M_current =
       (SimpleState **)
       std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::begin
                 ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffcc8
                 );
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::end
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffcc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                        *)in_stack_fffffffffffffcd0,
                       (__normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
                        *)in_stack_fffffffffffffcc8);
    if (!bVar1) break;
    ppSVar5 = __gnu_cxx::
              __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>
              ::operator*(&local_168);
    in_stack_fffffffffffffcc8 = *ppSVar5;
    if (in_stack_fffffffffffffcc8 != (SimpleState *)0x0) {
      operator_delete(in_stack_fffffffffffffcc8);
    }
    __gnu_cxx::
    __normal_iterator<SimpleState_**,_std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>_>::
    operator++(&local_168);
  }
  local_4 = 0;
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::~vector
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffce0);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::~vector
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffce0);
  std::
  vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  ::~vector((vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
             *)in_stack_fffffffffffffce0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::~Graph
            ((Graph<SimpleState_*,_double,_SimpleStateIndexer> *)in_stack_fffffffffffffcf0);
  std::vector<SimpleState_*,_std::allocator<SimpleState_*>_>::~vector
            ((vector<SimpleState_*,_std::allocator<SimpleState_*>_> *)in_stack_fffffffffffffce0);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  SimpleStateIndexer indexer;

  std::vector<SimpleState *> nodes;

  // create nodes
  for (int i = 0; i < ROW_SIZE; i++)
    for (int j = 0; j < COL_SIZE; j++) nodes.push_back(new SimpleState(i, j));

  // create a graph
  Graph<SimpleState *, double, SimpleStateIndexer> graph;

  graph.AddEdge(nodes[0], nodes[1], 1.0);
  graph.AddEdge(nodes[1], nodes[0], 1.0);
  graph.AddEdge(nodes[1], nodes[2], 1.0);
  graph.AddEdge(nodes[1], nodes[6], 1.414);
  graph.AddEdge(nodes[2], nodes[1], 1.0);
  graph.AddEdge(nodes[2], nodes[3], 1.0);
  graph.AddEdge(nodes[2], nodes[6], 1.0);
  graph.AddEdge(nodes[3], nodes[2], 1.0);
  graph.AddEdge(nodes[3], nodes[6], 1.414);
  graph.AddEdge(nodes[6], nodes[1], 1.414);
  graph.AddEdge(nodes[6], nodes[2], 1.0);
  graph.AddEdge(nodes[6], nodes[3], 1.414);
  graph.AddEdge(nodes[6], nodes[9], 1.414);
  graph.AddEdge(nodes[6], nodes[10], 1.0);
  graph.AddEdge(nodes[9], nodes[6], 1.414);
  graph.AddEdge(nodes[9], nodes[10], 1.0);
  graph.AddEdge(nodes[9], nodes[13], 1.0);
  graph.AddEdge(nodes[10], nodes[6], 1.0);
  graph.AddEdge(nodes[10], nodes[9], 1.0);
  graph.AddEdge(nodes[10], nodes[13], 1.414);
  graph.AddEdge(nodes[13], nodes[9], 1.0);
  graph.AddEdge(nodes[13], nodes[10], 1.414);

  auto all_edges = graph.GetAllEdges();

  for (auto &e : all_edges) e->PrintEdge();

  // In order to use A* search, you need to specify how to calculate heuristic
  std::cout << "\nA* search: " << std::endl;
  auto path_a = AStar::Search(
      &graph, 0, 13, CalcHeuristicFunc_t<SimpleState *>(CalcHeuristic));
  for (auto &e : path_a) std::cout << "id: " << indexer(e) << std::endl;

  // Dijkstra search
  std::cout << "\nDijkstra search: " << std::endl;
  auto path_d = Dijkstra::Search(&graph, 0, 13);
  for (auto &e : path_d) std::cout << "id: " << indexer(e) << std::endl;

  // need to delete all nodes, the graph only maintains pointers to these nodes
  for (auto &e : nodes) delete e;

  return 0;
}